

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool isLessInfeasibleDSECandidate(HighsLogOptions *log_options,HighsLp *lp)

{
  int iVar1;
  int *piVar2;
  const_reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  const_reference pvVar6;
  undefined8 uVar7;
  char *pcVar8;
  int *in_RSI;
  HighsLogType HVar9;
  HighsLogOptions *log_options_;
  double average_col_num_en;
  double value;
  HighsInt en;
  HighsInt col_num_en;
  HighsInt col;
  bool LiDSE_candidate;
  vector<int,_std::allocator<int>_> col_length_k;
  HighsInt max_average_col_num_en;
  HighsInt max_assess_col_num_en;
  HighsInt max_allowed_col_num_en;
  HighsInt max_col_num_en;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  value_type_conflict2 *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> *__new_size;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  int local_70;
  int local_68;
  int local_64;
  byte local_5d;
  undefined4 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  int *local_18;
  HighsLogType local_10;
  byte local_1;
  
  local_1c = 0xffffffff;
  local_20 = 0x18;
  local_28 = 9;
  local_18 = in_RSI;
  _local_10 = _HVar9;
  piVar2 = std::max<int>(&local_28,&local_20);
  local_24 = *piVar2;
  local_2c = 6;
  __new_size = &local_48;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5030e0);
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff80,(size_type)__new_size,in_stack_ffffffffffffff70);
  local_5d = 1;
  local_64 = 0;
  do {
    if (*local_18 <= local_64) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)*local_18);
      log_options_ = (HighsLogOptions *)((double)*pvVar3 / (double)*local_18);
      in_stack_ffffffffffffff67 = (local_5d & 1) != 0 && (double)log_options_ <= 6.0;
      local_5d = in_stack_ffffffffffffff67;
      uVar7 = std::__cxx11::string::c_str();
      pcVar8 = "is not";
      if ((local_5d & 1) != 0) {
        pcVar8 = "is";
      }
      highsLogDev(log_options_,_local_10,(char *)0x1,
                  "LP %s has all |entries|=1; max column count = %d (limit %d); average column count = %0.2g (limit %d): LP is %s a candidate for LiDSE\n"
                  ,uVar7,(ulong)local_1c,0x18,6,pcVar8);
      local_1 = local_5d & 1;
LAB_005033cc:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      return (bool)(local_1 & 1);
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)(local_64 + 1))
    ;
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)local_64);
    local_68 = iVar1 - *pvVar3;
    puVar4 = (uint *)std::max<int>(&local_68,(int *)&local_1c);
    local_1c = *puVar4;
    if (local_24 < local_68) {
      local_1 = 0;
      goto LAB_005033cc;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_68);
    *pvVar5 = *pvVar5 + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)local_64);
    for (local_70 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),
                            (long)(local_64 + 1)), local_70 < *pvVar3; local_70 = local_70 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x36),
                          (long)local_70);
      if ((ABS(*pvVar6) != 1.0) || (NAN(ABS(*pvVar6)))) {
        local_1 = 0;
        goto LAB_005033cc;
      }
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

bool isLessInfeasibleDSECandidate(const HighsLogOptions& log_options,
                                  const HighsLp& lp) {
  HighsInt max_col_num_en = -1;
  const HighsInt max_allowed_col_num_en = 24;
  const HighsInt max_assess_col_num_en =
      std::max(HighsInt{9}, max_allowed_col_num_en);
  const HighsInt max_average_col_num_en = 6;
  vector<HighsInt> col_length_k;
  col_length_k.resize(1 + max_assess_col_num_en, 0);
  bool LiDSE_candidate = true;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    // Check limit on number of entries in the column has not been breached
    HighsInt col_num_en =
        lp.a_matrix_.start_[col + 1] - lp.a_matrix_.start_[col];
    max_col_num_en = std::max(col_num_en, max_col_num_en);
    if (col_num_en > max_assess_col_num_en) return false;
    col_length_k[col_num_en]++;
    for (HighsInt en = lp.a_matrix_.start_[col];
         en < lp.a_matrix_.start_[col + 1]; en++) {
      double value = lp.a_matrix_.value_[en];
      // All nonzeros must be +1 or -1
      if (fabs(value) != 1) return false;
    }
  }
  double average_col_num_en = lp.a_matrix_.start_[lp.num_col_];
  average_col_num_en = average_col_num_en / lp.num_col_;
  LiDSE_candidate =
      LiDSE_candidate && average_col_num_en <= max_average_col_num_en;
  highsLogDev(log_options, HighsLogType::kInfo,
              "LP %s has all |entries|=1; max column count = %" HIGHSINT_FORMAT
              " (limit %" HIGHSINT_FORMAT
              "); average "
              "column count = %0.2g (limit %" HIGHSINT_FORMAT
              "): LP is %s a candidate for LiDSE\n",
              lp.model_name_.c_str(), max_col_num_en, max_allowed_col_num_en,
              average_col_num_en, max_average_col_num_en,
              LiDSE_candidate ? "is" : "is not");
  return LiDSE_candidate;
}